

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  extensions extensions;
  extensions extensions_00;
  int iVar2;
  long count;
  index_type count_00;
  undefined1 local_4a8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_478;
  _Elt_pointer local_468;
  _Map_pointer ppsStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  parser<(anonymous_namespace)::yaml_output> p_1;
  parser<(anonymous_namespace)::yaml_output> p;
  array<char,_256UL> buffer;
  
  if (1 < argc) {
    std::ifstream::ifstream(&buffer,argv[1],_S_in);
    memset(&p,0,0x100);
    local_478 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)ZEXT816(0);
    local_468 = (_Elt_pointer)0x0;
    ppsStack_460 = (_Map_pointer)0x0;
    local_458 = 0;
    uStack_450 = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_438 = 0;
    uStack_430 = 0;
    std::
    stack<std::shared_ptr<pstore::dump::value>,std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>>
    ::
    stack<std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>,void>
              ((stack<std::shared_ptr<pstore::dump::value>,_std::deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
                *)&local_478);
    pstore::json::parser<(anonymous_namespace)::yaml_output>::parser
              (&p_1,(yaml_output *)&local_478,extensions_00);
    iVar2 = 1;
    std::
    deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
    ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)&local_478);
    while ((*(uint *)(buffer._M_elems + *(long *)(buffer._M_elems._0_8_ + -0x18) + 0x20) & 7) == 0
           && p_1.error_._M_value == 0) {
      std::istream::read(buffer._M_elems,(long)&p);
      count_00 = buffer._M_elems._8_8_;
      if ((long)buffer._M_elems._8_8_ < 1) {
        count_00 = 0;
      }
      local_4a8._0_16_ = (undefined1  [16])pstore::gsl::make_span<char>((char *)&p,count_00);
      pstore::json::parser<(anonymous_namespace)::yaml_output>::input<pstore::gsl::span<char,_1l>>
                (&p_1,(span<char,__1L> *)local_4a8);
    }
    pstore::json::parser<(anonymous_namespace)::yaml_output>::eof
              ((parser<(anonymous_namespace)::yaml_output> *)(local_4a8 + 0x20));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480);
    if ((buffer._M_elems[*(long *)(buffer._M_elems._0_8_ + -0x18) + 0x20] & 1U) == 0) {
      if (p_1.error_._M_value == 0) {
        anon_unknown.dwarf_11733::yaml_output::result((yaml_output *)local_4a8);
        poVar1 = std::operator<<((ostream *)&std::cout,"\n----\n");
        (**(code **)(*(long *)local_4a8._0_8_ + 0x98))(local_4a8._0_8_,poVar1);
        std::operator<<(poVar1,'\n');
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4a8 + 8));
        iVar2 = 0;
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"Parse error: ");
        (**(code **)(*(long *)p_1.error_._M_cat + 0x20))
                  (local_4a8,p_1.error_._M_cat,p_1.error_._M_value);
        poVar1 = std::operator<<(poVar1,(string *)local_4a8);
        poVar1 = std::operator<<(poVar1," (Line ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,", column ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,")\n");
        std::__cxx11::string::~string((string *)local_4a8);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"There was an I/O error while reading.\n");
    }
    pstore::json::parser<(anonymous_namespace)::yaml_output>::~parser(&p_1);
    std::ifstream::~ifstream(&buffer);
    return iVar2;
  }
  memset(&buffer,0,0x100);
  p_1.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>,_std::default_delete<pstore::json::details::singleton_storage<(anonymous_namespace)::yaml_output>_>_>
          )0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  p_1.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  std::
  stack<std::shared_ptr<pstore::dump::value>,std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>>
  ::
  stack<std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>,void>
            ((stack<std::shared_ptr<pstore::dump::value>,_std::deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
              *)&p_1);
  pstore::json::parser<(anonymous_namespace)::yaml_output>::parser
            (&p,(yaml_output *)&p_1,extensions);
  std::
  deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~deque((deque<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            *)&p_1);
  while ((*(uint *)(__gmon_start__ + *(long *)(std::cin + -0x18)) & 7) == 0 &&
         p.error_._M_value == 0) {
    std::istream::read((char *)&std::cin,(long)&buffer);
    count = _ifstream;
    if (_ifstream < 1) {
      count = 0;
    }
    local_478 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                pstore::gsl::make_span<char>(buffer._M_elems,count);
    pstore::json::parser<(anonymous_namespace)::yaml_output>::input<pstore::gsl::span<char,_1l>>
              (&p,(span<char,__1L> *)&local_478);
  }
  pstore::json::parser<(anonymous_namespace)::yaml_output>::eof
            ((parser<(anonymous_namespace)::yaml_output> *)(local_4a8 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_480);
  if (((byte)__gmon_start__[*(long *)(std::cin + -0x18)] & 1) == 0) {
    if (p.error_._M_value == 0) {
      anon_unknown.dwarf_11733::yaml_output::result((yaml_output *)&local_478);
      poVar1 = std::operator<<((ostream *)&std::cout,"\n----\n");
      (**(code **)(*(long *)local_478.super_extent_type<_1L>.size_ + 0x98))
                (local_478.super_extent_type<_1L>.size_,poVar1);
      std::operator<<(poVar1,'\n');
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_478.data_);
      iVar2 = 0;
      goto LAB_00106ad6;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"Parse error: ");
    (**(code **)(*(long *)p.error_._M_cat + 0x20))(&local_478,p.error_._M_cat,p.error_._M_value);
    poVar1 = std::operator<<(poVar1,(string *)&local_478);
    poVar1 = std::operator<<(poVar1," (Line ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", column ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")\n");
    std::__cxx11::string::~string((string *)&local_478);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"There was an I/O error while reading.\n");
  }
  iVar2 = 1;
LAB_00106ad6:
  pstore::json::parser<(anonymous_namespace)::yaml_output>::~parser(&p);
  return iVar2;
}

Assistant:

int main (int argc, char const * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        if (argc < 2) {
            exit_code = slurp (std::cin);
        } else {
            std::ifstream input (argv[1]);
            exit_code = slurp (input);
        }
    }
    // clang-format off
    PSTORE_CATCH (std::exception const & ex, { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Error: ") << pstore::utf::to_native_string (ex.what ())
                     << PSTORE_NATIVE_TEXT ('\n');
        exit_code = EXIT_FAILURE;
    })
    // clang-format off
    PSTORE_CATCH (..., { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Unknown exception.\n");
        exit_code = EXIT_FAILURE;
    })
    return exit_code;
}